

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall ParserTest::AssertParse(ParserTest *this,char *input)

{
  Test *pTVar1;
  undefined8 __s;
  bool bVar2;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  string err;
  undefined1 local_78 [8];
  ManifestParser parser;
  char *input_local;
  ParserTest *this_local;
  
  parser._88_8_ = input;
  ManifestParserOptions::ManifestParserOptions((ManifestParserOptions *)((long)&err.field_2 + 8));
  ManifestParser::ManifestParser
            ((ManifestParser *)local_78,&this->state,(FileReader *)&this->fs_,
             (ManifestParserOptions)err.field_2._8_8_);
  std::__cxx11::string::string((string *)local_a0);
  __s = parser._88_8_;
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,(char *)__s,&local_c1);
  bVar2 = ManifestParser::ParseTest((ManifestParser *)local_78,&local_c0,(string *)local_a0);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
             ,0x1e,"parser.ParseTest(input, &err)");
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_a0);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                     ,0x1f,"\"\" == err");
  if (bVar2) {
    VerifyGraph(&this->state);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  std::__cxx11::string::~string((string *)local_a0);
  return;
}

Assistant:

void AssertParse(const char* input) {
    ManifestParser parser(&state, &fs_);
    string err;
    EXPECT_TRUE(parser.ParseTest(input, &err));
    ASSERT_EQ("", err);
    VerifyGraph(state);
  }